

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

void tinyobj::SplitString
               (string *s,char delim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *elems)

{
  istream *piVar1;
  undefined7 in_register_00000031;
  stringstream local_1d0 [8];
  stringstream ss;
  string local_1b8 [104];
  ios_base local_150 [264];
  undefined1 local_48 [8];
  string item;
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::__cxx11::stringbuf::str(local_1b8);
  item._M_dataplus._M_p = (pointer)0x0;
  item._M_string_length._0_1_ = 0;
  local_48 = (undefined1  [8])&item._M_string_length;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1d0,(string *)local_48,' ');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT71(in_register_00000031,delim),(value_type *)local_48);
  }
  if (local_48 != (undefined1  [8])&item._M_string_length) {
    operator_delete((void *)local_48,
                    CONCAT71(item._M_string_length._1_7_,(undefined1)item._M_string_length) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::ios_base::~ios_base(local_150);
  return;
}

Assistant:

static void SplitString(const std::string &s, char delim,
                        std::vector<std::string> &elems) {
  std::stringstream ss;
  ss.str(s);
  std::string item;
  while (std::getline(ss, item, delim)) {
    elems.push_back(item);
  }
}